

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_invoke(Executor *this,Worker *worker,Node *node)

{
  atomic<unsigned_long> *paVar1;
  Semaphores *pSVar2;
  Node *pNVar3;
  void *pvVar4;
  Node *pNVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  atomic<unsigned_long> *paVar9;
  size_t i;
  U *pUVar10;
  ulong uVar11;
  Node *cache;
  SmallVector<tf::Node_*,_2U> waiters;
  SmallVector<int,_2U> conds;
  Node *local_80;
  SmallVector<tf::Node_*,_2U> local_78;
  SmallVectorImpl<int> local_50;
  
  do {
    while( true ) {
      local_80 = (Node *)0x0;
      if ((node->_nstate & 0x20000000) != 0) break;
      bVar6 = Node::_is_cancelled(node);
      if (!bVar6) {
        pSVar2 = (node->_semaphores)._M_t.
                 super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                 .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
        if ((pSVar2 != (Semaphores *)0x0) && (*(long *)pSVar2 != *(long *)&pSVar2->field_0x8)) {
          local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
          .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX =
               &local_78.super_SmallVectorImpl<tf::Node_*>.
                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
          local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
          .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
               &local_50;
          local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
          .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
               local_78.super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          bVar6 = Node::_acquire_all(node,&local_78);
          if (!bVar6) {
            _schedule<tf::Node**>
                      (this,worker,
                       (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                super_SmallVectorBase.BeginX,
                       (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                super_SmallVectorBase.EndX);
            SmallVectorImpl<tf::Node_*>::~SmallVectorImpl
                      (&local_78.super_SmallVectorImpl<tf::Node_*>);
            return;
          }
          SmallVectorImpl<tf::Node_*>::~SmallVectorImpl(&local_78.super_SmallVectorImpl<tf::Node_*>)
          ;
        }
        break;
      }
      _tear_down_invoke(this,worker,node,&local_80);
      node = local_80;
      if (local_80 == (Node *)0x0) {
        return;
      }
    }
    local_50.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.BeginX =
         &local_50.super_SmallVectorTemplateBase<int,_true>.
          super_SmallVectorTemplateCommon<int,_void>.FirstEl;
    local_50.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.CapacityX = &stack0xffffffffffffffd0;
    local_50.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX =
         local_50.super_SmallVectorTemplateBase<int,_true>.
         super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    switch(*(__index_type *)
            ((long)&(node->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x38)) {
    case '\x01':
      _invoke_static_task(this,worker,node);
      break;
    case '\x02':
      bVar7 = _invoke_runtime_task(this,worker,node);
      goto LAB_00106ac5;
    case '\x03':
      bVar7 = _invoke_subflow_task(this,worker,node);
      goto LAB_00106ac5;
    case '\x04':
      _invoke_condition_task(this,worker,node,(SmallVector<int,_2U> *)&local_50);
      break;
    case '\x05':
      _invoke_multi_condition_task(this,worker,node,(SmallVector<int,_2U> *)&local_50);
      break;
    case '\x06':
      bVar7 = _invoke_module_task(this,worker,node);
LAB_00106ac5:
      bVar6 = true;
      if (bVar7 == false) break;
      goto LAB_00106c40;
    case '\a':
      bVar7 = _invoke_async_task(this,worker,node);
      bVar6 = true;
      if (!bVar7) {
        _tear_down_async(this,worker,node,&local_80);
LAB_00106c7d:
        bVar6 = local_80 == (Node *)0x0;
        if (!bVar6) {
          node = local_80;
        }
      }
      goto LAB_00106c40;
    case '\b':
      bVar7 = _invoke_dependent_async_task(this,worker,node);
      bVar6 = true;
      if (!bVar7) {
        _tear_down_dependent_async(this,worker,node,&local_80);
        goto LAB_00106c7d;
      }
      goto LAB_00106c40;
    }
    pSVar2 = (node->_semaphores)._M_t.
             super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
             ._M_t.
             super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
             .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
    if ((pSVar2 != (Semaphores *)0x0) &&
       (*(long *)&pSVar2->to_release != *(long *)&pSVar2->field_0x30)) {
      local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX =
           &local_78.super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
      local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX = &local_50;
      local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
           local_78.super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      Node::_release_all(node,&local_78);
      _schedule<tf::Node**>
                (this,worker,
                 (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                          super_SmallVectorTemplateBase<tf::Node_*,_true>.
                          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                          BeginX,
                 (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                          super_SmallVectorTemplateBase<tf::Node_*,_true>.
                          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                          EndX);
      SmallVectorImpl<tf::Node_*>::~SmallVectorImpl(&local_78.super_SmallVectorImpl<tf::Node_*>);
    }
    pvVar4 = local_50.super_SmallVectorTemplateBase<int,_true>.
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
    uVar8 = node->_num_successors;
    LOCK();
    (node->_join_counter).super___atomic_base<unsigned_long>._M_i =
         (node->_join_counter).super___atomic_base<unsigned_long>._M_i +
         (((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
           (long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX >> 3
          ) - ((node->_nstate & 0xfffffff) + uVar8));
    UNLOCK();
    if (node->_parent == (Node *)0x0) {
      paVar9 = &node->_topology->_join_counter;
    }
    else {
      paVar9 = &node->_parent->_join_counter;
    }
    pUVar10 = (U *)local_50.super_SmallVectorTemplateBase<int,_true>.
                   super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    if ((*(__index_type *)
          ((long)&(node->_handle).
                  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          + 0x38) & 0xfe) == 4) {
      for (; pUVar10 != (U *)pvVar4; pUVar10 = pUVar10 + 1) {
        uVar8 = (ulong)*(int *)pUVar10->buff;
        pNVar3 = local_80;
        if ((-1 < (long)uVar8) && (uVar8 < node->_num_successors)) {
          pNVar3 = *(Node **)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                    super_SmallVectorBase.BeginX + uVar8 * 8);
          (pNVar3->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
          LOCK();
          (paVar9->super___atomic_base<unsigned_long>)._M_i =
               (paVar9->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          if (local_80 != (Node *)0x0) {
            _schedule(this,worker,local_80);
          }
        }
        local_80 = pNVar3;
      }
    }
    else {
      for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
        pNVar3 = *(Node **)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                                  super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                  super_SmallVectorBase.BeginX + uVar11 * 8);
        LOCK();
        paVar1 = &pNVar3->_join_counter;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        pNVar5 = local_80;
        if ((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) {
          LOCK();
          (paVar9->super___atomic_base<unsigned_long>)._M_i =
               (paVar9->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          pNVar5 = pNVar3;
          if (local_80 != (Node *)0x0) {
            _schedule(this,worker,local_80);
          }
        }
        local_80 = pNVar5;
        uVar8 = node->_num_successors;
      }
    }
    _tear_down_invoke(this,worker,node,&local_80);
    bVar6 = local_80 == (Node *)0x0;
    if (!bVar6) {
      node = local_80;
    }
LAB_00106c40:
    SmallVectorImpl<int>::~SmallVectorImpl(&local_50);
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

inline void Executor::_invoke(Worker& worker, Node* node) {

  #define TF_INVOKE_CONTINUATION()  \
  if (cache) {                      \
    node = cache;                   \
    goto begin_invoke;              \
  }

  begin_invoke:

  Node* cache {nullptr};
  
  // if this is the second invoke due to preemption, directly jump to invoke task
  if(node->_nstate & NSTATE::PREEMPTED) {
    goto invoke_task;
  }

  // if the work has been cancelled, there is no need to continue
  if(node->_is_cancelled()) {
    _tear_down_invoke(worker, node, cache);
    TF_INVOKE_CONTINUATION();
    return;
  }

  // if acquiring semaphore(s) exists, acquire them first
  if(node->_semaphores && !node->_semaphores->to_acquire.empty()) {
    SmallVector<Node*> waiters;
    if(!node->_acquire_all(waiters)) {
      _schedule(worker, waiters.begin(), waiters.end());
      return;
    }
  }
  
  invoke_task:
  
  SmallVector<int> conds;

  // switch is faster than nested if-else due to jump table
  switch(node->_handle.index()) {
    // static task
    case Node::STATIC:{
      _invoke_static_task(worker, node);
    }
    break;
    
    // runtime task
    case Node::RUNTIME:{
      if(_invoke_runtime_task(worker, node)) {
        return;
      }
    }
    break;

    // subflow task
    case Node::SUBFLOW: {
      if(_invoke_subflow_task(worker, node)) {
        return;
      }
    }
    break;

    // condition task
    case Node::CONDITION: {
      _invoke_condition_task(worker, node, conds);
    }
    break;

    // multi-condition task
    case Node::MULTI_CONDITION: {
      _invoke_multi_condition_task(worker, node, conds);
    }
    break;

    // module task
    case Node::MODULE: {
      if(_invoke_module_task(worker, node)) {
        return;
      }
    }
    break;

    // async task
    case Node::ASYNC: {
      if(_invoke_async_task(worker, node)) {
        return;
      }
      _tear_down_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // dependent async task
    case Node::DEPENDENT_ASYNC: {
      if(_invoke_dependent_async_task(worker, node)) {
        return;
      }
      _tear_down_dependent_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // monostate (placeholder)
    default:
    break;
  }

  // if releasing semaphores exist, release them
  if(node->_semaphores && !node->_semaphores->to_release.empty()) {
    SmallVector<Node*> waiters;
    node->_release_all(waiters);
    _schedule(worker, waiters.begin(), waiters.end());
  }

  // Reset the join counter with strong dependencies to support cycles.
  // + We must do this before scheduling the successors to avoid race
  //   condition on _predecessors.
  // + We must use fetch_add instead of direct assigning
  //   because the user-space call on "invoke" may explicitly schedule 
  //   this task again (e.g., pipeline) which can access the join_counter.
  node->_join_counter.fetch_add(
    node->num_predecessors() - (node->_nstate & ~NSTATE::MASK), std::memory_order_relaxed
  );

  // acquire the parent flow counter
  auto& join_counter = (node->_parent) ? node->_parent->_join_counter :
                       node->_topology->_join_counter;

  // Invoke the task based on the corresponding type
  switch(node->_handle.index()) {

    // condition and multi-condition tasks
    case Node::CONDITION:
    case Node::MULTI_CONDITION: {
      for(auto cond : conds) {
        if(cond >= 0 && static_cast<size_t>(cond) < node->_num_successors) {
          auto s = node->_edges[cond]; 
          // zeroing the join counter for invariant
          s->_join_counter.store(0, std::memory_order_relaxed);
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;

    // non-condition task
    default: {
      for(size_t i=0; i<node->_num_successors; ++i) {
        //if(auto s = node->_successors[i]; --(s->_join_counter) == 0) {
        if(auto s = node->_edges[i]; s->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;
  }
  
  // clean up the node after execution
  _tear_down_invoke(worker, node, cache);
  TF_INVOKE_CONTINUATION();
}